

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_coding.cc
# Opt level: O0

bool __thiscall
sptk::HuffmanCoding::Run
          (HuffmanCoding *this,vector<double,_std::allocator<double>_> *probabilities,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *codewords)

{
  size_type sVar1;
  reference this_00;
  Node *this_01;
  const_reference pvVar2;
  size_type sVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  Node *right;
  Node *left;
  int i;
  priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
  tree;
  Node *in_stack_fffffffffffffef0;
  Node *in_stack_ffffffffffffff00;
  Node *in_stack_ffffffffffffff08;
  allocator *paVar4;
  Node *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  Node *in_stack_ffffffffffffff70;
  int local_44;
  bool local_1;
  
  if ((((*(byte *)(in_RDI + 0xc) & 1) == 0) ||
      (sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
      sVar1 != (long)*(int *)(in_RDI + 8))) ||
     (in_RDX == (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0)) {
    local_1 = false;
  }
  else {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDX);
    if (sVar1 != (long)*(int *)(in_RDI + 8)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
    }
    if (*(int *)(in_RDI + 8) == 1) {
      this_00 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](in_RDX,0);
      std::__cxx11::string::operator=((string *)this_00,"0");
      local_1 = true;
    }
    else {
      std::
      priority_queue<(anonymous_namespace)::Node*,std::vector<(anonymous_namespace)::Node*,std::allocator<(anonymous_namespace)::Node*>>,(anonymous_namespace)::Compare>
      ::
      priority_queue<std::vector<(anonymous_namespace)::Node*,std::allocator<(anonymous_namespace)::Node*>>,void>
                ((priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
                  *)in_stack_fffffffffffffef0);
      for (local_44 = 0; local_44 < *(int *)(in_RDI + 8); local_44 = local_44 + 1) {
        this_01 = (Node *)operator_new(0x28);
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_44);
        anon_unknown.dwarf_838f::Node::Node(this_01,local_44,*pvVar2);
        std::
        priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
        ::push((priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
                *)in_stack_ffffffffffffff10,(value_type *)in_stack_ffffffffffffff08);
      }
      while (sVar3 = std::
                     priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
                     ::size((priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
                             *)0x1070b7), 1 < sVar3) {
        std::
        priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
        ::top((priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
               *)0x1070de);
        std::
        priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
        ::pop((priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
               *)in_stack_ffffffffffffff00);
        std::
        priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
        ::top((priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
               *)0x107111);
        std::
        priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
        ::pop((priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
               *)in_stack_ffffffffffffff00);
        operator_new(0x28);
        anon_unknown.dwarf_838f::Node::Node
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        std::
        priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
        ::push((priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
                *)in_stack_ffffffffffffff10,(value_type *)in_stack_ffffffffffffff08);
      }
      std::
      priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
      ::top((priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
             *)0x107246);
      paVar4 = (allocator *)&stack0xffffffffffffff67;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff68,"",paVar4);
      anon_unknown.dwarf_838f::Encode
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
      std::
      priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
      ::top((priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
             *)0x1072c4);
      anon_unknown.dwarf_838f::Free(in_stack_fffffffffffffef0);
      local_1 = true;
      std::
      priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
      ::~priority_queue((priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
                         *)0x1073e7);
    }
  }
  return local_1;
}

Assistant:

bool HuffmanCoding::Run(const std::vector<double>& probabilities,
                        std::vector<std::string>* codewords) const {
  // Check inputs.
  if (!is_valid_ ||
      probabilities.size() != static_cast<std::size_t>(num_element_) ||
      NULL == codewords) {
    return false;
  }

  // Prepare memories.
  if (codewords->size() != static_cast<std::size_t>(num_element_)) {
    codewords->resize(num_element_);
  }

  if (1 == num_element_) {
    (*codewords)[0] = "0";
    return true;
  }

  std::priority_queue<Node*, std::vector<Node*>, Compare> tree;

  try {
    for (int i(0); i < num_element_; ++i) {
      tree.push(new Node(i, probabilities[i]));
    }
    while (1 < tree.size()) {
      const Node* left(tree.top());
      tree.pop();
      const Node* right(tree.top());
      tree.pop();

      try {
        tree.push(new Node(left, right));
      } catch (...) {
        delete left;
        delete right;
        throw;
      }
    }
    Encode(tree.top(), "", codewords);
    Free(tree.top());
  } catch (...) {
    while (!tree.empty()) {
      Free(tree.top());
      tree.pop();
    }
    return false;
  }

  return true;
}